

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

lzma_ret lzma_next_filter_update
                   (lzma_next_coder *next,lzma_allocator *allocator,lzma_filter *reversed_filters)

{
  lzma_ret lVar1;
  
  lVar1 = LZMA_PROG_ERROR;
  if (reversed_filters->id == next->id) {
    if (reversed_filters->id != 0xffffffffffffffff) {
      if (next->update !=
          (_func_lzma_ret_void_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr *)0x0) {
        lVar1 = (*next->update)(next->coder,allocator,(lzma_filter *)0x0,reversed_filters);
        return lVar1;
      }
      __assert_fail("next->update != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/common.c"
                    ,0x8b,
                    "lzma_ret lzma_next_filter_update(lzma_next_coder *, const lzma_allocator *, const lzma_filter *)"
                   );
    }
    lVar1 = LZMA_OK;
  }
  return lVar1;
}

Assistant:

extern lzma_ret
lzma_next_filter_update(lzma_next_coder *next, const lzma_allocator *allocator,
		const lzma_filter *reversed_filters)
{
	// Check that the application isn't trying to change the Filter ID.
	// End of filters is indicated with LZMA_VLI_UNKNOWN in both
	// reversed_filters[0].id and next->id.
	if (reversed_filters[0].id != next->id)
		return LZMA_PROG_ERROR;

	if (reversed_filters[0].id == LZMA_VLI_UNKNOWN)
		return LZMA_OK;

	assert(next->update != NULL);
	return next->update(next->coder, allocator, NULL, reversed_filters);
}